

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O1

void __thiscall Memory::LargeHeapBlock::ReleasePages(LargeHeapBlock *this,Recycler *recycler)

{
  uint uVar1;
  PageHeapData *pPVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  IdleDecommitPageAllocator *this_00;
  char *pcVar7;
  char **ppcVar8;
  long lVar9;
  char *__s;
  size_t pageCount;
  DWORD local_2c [2];
  DWORD oldProtect;
  
  if ((this->super_HeapBlock).segment == (Segment *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x158,"(segment != nullptr)","segment != nullptr");
    if (!bVar4) goto LAB_006f0a57;
    *puVar6 = 0;
  }
  this_00 = HeapInfo::GetRecyclerLargeBlockPageAllocator(this->heapInfo);
  __s = (this->super_HeapBlock).address;
  pageCount = this->pageCount;
  pPVar2 = this->pageHeapData;
  if ((pPVar2 == (PageHeapData *)0x0) || (pPVar2->pageHeapMode == PageHeapModeOff))
  goto LAB_006f0a17;
  uVar1 = pPVar2->actualPageCount;
  lVar9 = uVar1 - pageCount;
  if (pPVar2->isGuardPageDecommitted == true) {
    if ((this_00->super_PageAllocator).disablePageReuse == false) {
      pcVar7 = (char *)VirtualAlloc(pPVar2->guardPageAddress,lVar9 * 0x1000,0x1000,4);
    }
    else {
      pcVar7 = (char *)0x0;
    }
    if ((pcVar7 == this->pageHeapData->guardPageAddress) &&
       ((this_00->super_PageAllocator).disablePageReuse != true)) goto LAB_006f09f7;
    VirtualFree(this->pageHeapData->objectPageAddr,this->pageCount << 0xc,0x4000);
    (this->super_HeapBlock).segment = (Segment *)0x0;
    bVar4 = false;
  }
  else {
    BVar5 = VirtualProtect(pPVar2->guardPageAddress,lVar9 * 0x1000,4,local_2c);
    if ((BVar5 == 0) || (local_2c[0] != 1)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x17e,"(ret && oldProtect == 0x01)","ret && oldProtect == PAGE_NOACCESS");
      if (!bVar4) {
LAB_006f0a57:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
LAB_006f09f7:
    pPVar2 = this->pageHeapData;
    ppcVar8 = &pPVar2->objectPageAddr;
    if (pPVar2->pageHeapMode == PageHeapModeBlockStart) {
      ppcVar8 = &pPVar2->guardPageAddress;
    }
    __s = *ppcVar8;
    bVar4 = true;
  }
  pageCount = (ulong)uVar1;
  if (!bVar4) {
    return;
  }
LAB_006f0a17:
  if (__s != (char *)0x0) {
    memset(__s,0xfe,pageCount << 0xc);
  }
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::Release(&this_00->super_PageAllocator,__s,pageCount,(this->super_HeapBlock).segment);
  (this->super_HeapBlock).segment = (Segment *)0x0;
  return;
}

Assistant:

void
LargeHeapBlock::ReleasePages(Recycler * recycler)
{
    Assert(segment != nullptr);

    IdleDecommitPageAllocator* pageAllocator = heapInfo->GetRecyclerLargeBlockPageAllocator();
    char* blockStartAddress = this->address;
    size_t realPageCount = this->pageCount;
#ifdef RECYCLER_PAGE_HEAP
    if (InPageHeapMode())
    {
        size_t guardPageCount = pageHeapData->actualPageCount - this->pageCount;
        realPageCount = pageHeapData->actualPageCount;

        if (pageHeapData->isGuardPageDecommitted)
        {
            void* addr = nullptr;
#ifdef RECYCLER_NO_PAGE_REUSE
            if (!pageAllocator->IsPageReuseDisabled())
#endif
            {
                addr = VirtualAlloc(pageHeapData->guardPageAddress, AutoSystemInfo::PageSize * guardPageCount, MEM_COMMIT, PAGE_READWRITE);
            }

            if (addr != pageHeapData->guardPageAddress // failed to re-commit guard page
#ifdef RECYCLER_NO_PAGE_REUSE
                || pageAllocator->IsPageReuseDisabled()
#endif
                )
            {
#pragma prefast(suppress:6250, "Calling 'VirtualFree' without the MEM_RELEASE flag might free memory but not address descriptors (VADs).")
                VirtualFree((char*)pageHeapData->objectPageAddr, this->pageCount* AutoSystemInfo::PageSize, MEM_DECOMMIT);
                RECYCLER_PERF_COUNTER_SUB(LargeHeapBlockPageSize, pageCount * AutoSystemInfo::PageSize);
                this->segment = nullptr;
                return;
            }
        }
        else
        {
            DWORD oldProtect;
            BOOL ret = ::VirtualProtect(pageHeapData->guardPageAddress, AutoSystemInfo::PageSize * guardPageCount, PAGE_READWRITE, &oldProtect);
            Assert(ret && oldProtect == PAGE_NOACCESS);
        }

        blockStartAddress = pageHeapData->pageHeapMode == PageHeapMode::PageHeapModeBlockStart ?
            pageHeapData->guardPageAddress : pageHeapData->objectPageAddr;

    }
#endif

#ifdef RECYCLER_FREE_MEM_FILL
    if(blockStartAddress != nullptr)
    {
        memset(blockStartAddress, DbgMemFill, AutoSystemInfo::PageSize * realPageCount);
    }
#endif
    pageAllocator->Release(blockStartAddress, realPageCount, segment);
    RECYCLER_PERF_COUNTER_SUB(LargeHeapBlockPageSize, pageCount * AutoSystemInfo::PageSize);
    this->segment = nullptr;
}